

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_copy_to_file.cpp
# Opt level: O3

PhysicalOperator * __thiscall
duckdb::PhysicalPlanGenerator::CreatePlan(PhysicalPlanGenerator *this,LogicalCopyToFile *op)

{
  pointer *pprVar1;
  string *file_path;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  copy_to_execution_mode_t p_Var3;
  iterator iVar4;
  idx_t iVar5;
  bool bVar6;
  bool bVar7;
  CopyFunctionExecutionMode CVar8;
  reference this_00;
  type op_00;
  PhysicalOperator *pPVar9;
  FileSystem *this_01;
  pointer pPVar10;
  PhysicalBatchCopyToFile *pPVar11;
  PhysicalCopyToFile *pPVar12;
  InvalidInputException *this_02;
  InternalException *this_03;
  string path;
  string base;
  string local_b8;
  PhysicalOperator *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
            ::operator[](&(op->super_LogicalOperator).children,0);
  op_00 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
          operator*(this_00);
  pPVar9 = CreatePlan(this,op_00);
  bVar6 = PreserveInsertionOrder(this->context,pPVar9);
  bVar7 = UseBatchIndex(this->context,pPVar9);
  if (op->preserve_order == PRESERVE_ORDER) {
    bVar6 = true;
  }
  else if (op->preserve_order == DONT_PRESERVE_ORDER) {
    bVar6 = false;
  }
  local_98 = pPVar9;
  this_01 = FileSystem::GetFileSystem(this->context);
  file_path = &op->file_path;
  (*this_01->_vptr_FileSystem[0x17])(&local_b8,this_01,file_path);
  ::std::__cxx11::string::operator=((string *)file_path,(string *)&local_b8);
  paVar2 = &local_b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (op->use_tmp_file == true) {
    StringUtil::GetFilePath(&local_b8,file_path);
    StringUtil::GetFileName(&local_70,file_path);
    ::std::operator+(&local_90,"tmp_",&local_70);
    FileSystem::JoinPath(&local_50,this_01,&local_b8,&local_90);
    ::std::__cxx11::string::operator=((string *)file_path,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
  }
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  if ((((op->per_thread_output != false) || ((op->file_size_bytes).index != 0xffffffffffffffff)) ||
      (op->rotate != false)) ||
     ((op->partition_output != false ||
      ((op->partition_columns).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (op->partition_columns).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish)))) {
    if (op->preserve_order == PRESERVE_ORDER) {
      this_02 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,"PRESERVE_ORDER is not supported with these parameters","");
      InvalidInputException::InvalidInputException(this_02,&local_b8);
      __cxa_throw(this_02,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    bVar7 = false;
    bVar6 = false;
  }
  p_Var3 = (op->function).execution_mode;
  if (p_Var3 == (copy_to_execution_mode_t)0x0) {
    CVar8 = REGULAR_COPY_TO_FILE;
  }
  else {
    CVar8 = (*p_Var3)(bVar6,bVar7);
    if (CVar8 == BATCH_COPY_TO_FILE) {
      if (bVar7 != false) {
        pPVar10 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>
                  ::operator->(&this->physical_plan);
        pPVar9 = PhysicalPlan::
                 Make<duckdb::PhysicalBatchCopyToFile,duckdb::vector<duckdb::LogicalType,true>&,duckdb::CopyFunction&,duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>,unsigned_long&>
                           (pPVar10,&(op->super_LogicalOperator).types,&op->function,&op->bind_data,
                            &(op->super_LogicalOperator).estimated_cardinality);
        pPVar11 = PhysicalOperator::Cast<duckdb::PhysicalBatchCopyToFile>(pPVar9);
        ::std::__cxx11::string::_M_assign((string *)&pPVar11->file_path);
        pPVar11->use_tmp_file = op->use_tmp_file;
        local_b8._M_dataplus._M_p = (pointer)local_98;
        iVar4._M_current =
             (pPVar11->super_PhysicalOperator).children.
             super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (pPVar11->super_PhysicalOperator).children.
            super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
            .
            super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::
          vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
          ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator>>
                    ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                      *)&(pPVar11->super_PhysicalOperator).children,iVar4,
                     (reference_wrapper<duckdb::PhysicalOperator> *)&local_b8);
        }
        else {
          (iVar4._M_current)->_M_data = local_98;
          pprVar1 = &(pPVar11->super_PhysicalOperator).children.
                     super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                     .
                     super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pprVar1 = *pprVar1 + 1;
        }
        pPVar11->return_type = op->return_type;
        pPVar11->write_empty_file = op->write_empty_file;
        return pPVar9;
      }
      this_03 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,
                 "BATCH_COPY_TO_FILE can only be used if batch indexes are supported","");
      InternalException::InternalException(this_03,&local_b8);
      __cxa_throw(this_03,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  pPVar10 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
            operator->(&this->physical_plan);
  pPVar9 = PhysicalPlan::
           Make<duckdb::PhysicalCopyToFile,duckdb::vector<duckdb::LogicalType,true>&,duckdb::CopyFunction&,duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>,unsigned_long&>
                     (pPVar10,&(op->super_LogicalOperator).types,&op->function,&op->bind_data,
                      &(op->super_LogicalOperator).estimated_cardinality);
  pPVar12 = PhysicalOperator::Cast<duckdb::PhysicalCopyToFile>(pPVar9);
  ::std::__cxx11::string::_M_assign((string *)&pPVar12->file_path);
  pPVar12->use_tmp_file = op->use_tmp_file;
  pPVar12->overwrite_mode = op->overwrite_mode;
  ::std::__cxx11::string::_M_assign((string *)&pPVar12->filename_pattern);
  (pPVar12->filename_pattern).uuid = (op->filename_pattern).uuid;
  (pPVar12->filename_pattern).pos = (op->filename_pattern).pos;
  ::std::__cxx11::string::_M_assign((string *)&pPVar12->file_extension);
  pPVar12->per_thread_output = op->per_thread_output;
  iVar5 = (op->file_size_bytes).index;
  if (iVar5 != 0xffffffffffffffff) {
    (pPVar12->file_size_bytes).index = iVar5;
  }
  pPVar12->rotate = op->rotate;
  pPVar12->return_type = op->return_type;
  pPVar12->partition_output = op->partition_output;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&pPVar12->partition_columns,
             &(op->partition_columns).super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  pPVar12->write_partition_columns = op->write_partition_columns;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&pPVar12->names,
              &(op->names).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             &pPVar12->expected_types,
             &(op->expected_types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  pPVar12->parallel = CVar8 == PARALLEL_COPY_TO_FILE;
  pPVar12->write_empty_file = op->write_empty_file;
  local_b8._M_dataplus._M_p = (pointer)local_98;
  iVar4._M_current =
       (pPVar12->super_PhysicalOperator).children.
       super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       .
       super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (pPVar12->super_PhysicalOperator).children.
      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    ::std::
    vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
    ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator>>
              ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                *)&(pPVar12->super_PhysicalOperator).children,iVar4,
               (reference_wrapper<duckdb::PhysicalOperator> *)&local_b8);
  }
  else {
    (iVar4._M_current)->_M_data = local_98;
    pprVar1 = &(pPVar12->super_PhysicalOperator).children.
               super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pprVar1 = *pprVar1 + 1;
  }
  return pPVar9;
}

Assistant:

PhysicalOperator &PhysicalPlanGenerator::CreatePlan(LogicalCopyToFile &op) {
	auto &plan = CreatePlan(*op.children[0]);
	bool preserve_insertion_order = PhysicalPlanGenerator::PreserveInsertionOrder(context, plan);
	bool supports_batch_index = PhysicalPlanGenerator::UseBatchIndex(context, plan);

	if (op.preserve_order == PreserveOrderType::PRESERVE_ORDER) {
		preserve_insertion_order = true;
	} else if (op.preserve_order == PreserveOrderType::DONT_PRESERVE_ORDER) {
		preserve_insertion_order = false;
	}

	auto &fs = FileSystem::GetFileSystem(context);
	op.file_path = fs.ExpandPath(op.file_path);

	if (op.use_tmp_file) {
		auto path = StringUtil::GetFilePath(op.file_path);
		auto base = StringUtil::GetFileName(op.file_path);
		op.file_path = fs.JoinPath(path, "tmp_" + base);
	}
	if (op.per_thread_output || op.file_size_bytes.IsValid() || op.rotate || op.partition_output ||
	    !op.partition_columns.empty()) {
		if (op.preserve_order == PreserveOrderType::PRESERVE_ORDER) {
			throw InvalidInputException("PRESERVE_ORDER is not supported with these parameters");
		}
		// hive-partitioning/per-thread output does not care about insertion order, and does not support batch indexes
		preserve_insertion_order = false;
		supports_batch_index = false;
	}
	auto mode = CopyFunctionExecutionMode::REGULAR_COPY_TO_FILE;
	if (op.function.execution_mode) {
		mode = op.function.execution_mode(preserve_insertion_order, supports_batch_index);
	}
	if (mode == CopyFunctionExecutionMode::BATCH_COPY_TO_FILE) {
		if (!supports_batch_index) {
			throw InternalException("BATCH_COPY_TO_FILE can only be used if batch indexes are supported");
		}
		// batched copy to file
		auto &copy =
		    Make<PhysicalBatchCopyToFile>(op.types, op.function, std::move(op.bind_data), op.estimated_cardinality);

		auto &cast_copy = copy.Cast<PhysicalBatchCopyToFile>();
		cast_copy.file_path = op.file_path;
		cast_copy.use_tmp_file = op.use_tmp_file;
		cast_copy.children.push_back(plan);
		cast_copy.return_type = op.return_type;
		cast_copy.write_empty_file = op.write_empty_file;
		return copy;
	}

	// COPY from select statement to file
	auto &copy = Make<PhysicalCopyToFile>(op.types, op.function, std::move(op.bind_data), op.estimated_cardinality);

	auto &cast_copy = copy.Cast<PhysicalCopyToFile>();
	cast_copy.file_path = op.file_path;
	cast_copy.use_tmp_file = op.use_tmp_file;
	cast_copy.overwrite_mode = op.overwrite_mode;
	cast_copy.filename_pattern = op.filename_pattern;
	cast_copy.file_extension = op.file_extension;
	cast_copy.per_thread_output = op.per_thread_output;

	if (op.file_size_bytes.IsValid()) {
		cast_copy.file_size_bytes = op.file_size_bytes;
	}

	cast_copy.rotate = op.rotate;
	cast_copy.return_type = op.return_type;
	cast_copy.partition_output = op.partition_output;
	cast_copy.partition_columns = op.partition_columns;
	cast_copy.write_partition_columns = op.write_partition_columns;
	cast_copy.names = op.names;
	cast_copy.expected_types = op.expected_types;
	cast_copy.parallel = mode == CopyFunctionExecutionMode::PARALLEL_COPY_TO_FILE;
	cast_copy.write_empty_file = op.write_empty_file;

	cast_copy.children.push_back(plan);
	return copy;
}